

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O1

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,PrintStatement *ptr)

{
  int iVar1;
  StatementWrapper *this_00;
  PrintStatement *this_01;
  undefined4 extraout_var;
  
  (**(ptr->to_print->super_Base)._vptr_Base)(ptr->to_print,this);
  this_00 = (StatementWrapper *)operator_new(0x10);
  this_01 = (PrintStatement *)operator_new(0x10);
  iVar1 = (*this->curr_wrapper->_vptr_SubtreeWrapper[2])();
  IRT::PrintStatement::PrintStatement(this_01,(Expression *)CONCAT44(extraout_var,iVar1));
  IRT::StatementWrapper::StatementWrapper(this_00,(Statement *)this_01);
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(PrintStatement* ptr) {

    ptr->to_print->accept(this);
    curr_wrapper = new IRT::StatementWrapper(
        new IRT::PrintStatement(curr_wrapper->ToExpression())
    );
}